

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O1

void __thiscall
sc_core::wif_enum_trace::print_variable_declaration_line(wif_enum_trace *this,FILE *f)

{
  ulong uVar1;
  
  fprintf((FILE *)f,"type scalar \"%s\" enum ",(this->super_wif_trace).wif_type);
  if (this->nliterals != 0) {
    uVar1 = 0;
    do {
      fprintf((FILE *)f,"\"%s\", ",this->literals[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->nliterals);
  }
  fwrite("\"SC_WIF_UNDEF\" ;\n",0x11,1,(FILE *)f);
  fprintf((FILE *)f,"declare  %s   \"%s\"  \"%s\" ",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,
          (this->super_wif_trace).name._M_dataplus._M_p,(this->super_wif_trace).wif_type);
  fwrite("variable ;\n",0xb,1,(FILE *)f);
  fprintf((FILE *)f,"start_trace %s ;\n",(this->super_wif_trace).wif_name._M_dataplus._M_p);
  return;
}

Assistant:

void wif_enum_trace::print_variable_declaration_line(FILE* f)
{
    std::fprintf(f, "type scalar \"%s\" enum ", wif_type);

    for (unsigned i = 0; i < nliterals; i++)
      std::fprintf(f, "\"%s\", ", literals[i]);
    std::fprintf(f, "\"SC_WIF_UNDEF\" ;\n");

    std::fprintf(f, "declare  %s   \"%s\"  \"%s\" ",
	    wif_name.c_str(), name.c_str(), wif_type);
    std::fprintf(f, "variable ;\n");
    std::fprintf(f, "start_trace %s ;\n", wif_name.c_str());
}